

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTigerWithCreaks.cpp
# Opt level: O2

void __thiscall ProblemDecTigerWithCreaks::FillTransitionModel(ProblemDecTigerWithCreaks *this)

{
  TransitionModelDiscrete *pTVar1;
  Index IVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Index s2;
  ulong uVar6;
  Index ja;
  
  uVar3 = *(ulong *)&(this->super_DecPOMDPDiscrete).field_0x220;
  for (uVar5 = 0; uVar5 < uVar3; uVar5 = (ulong)((int)uVar5 + 1)) {
    for (uVar6 = 0; uVar6 < uVar3; uVar6 = (ulong)((int)uVar6 + 1)) {
      uVar3 = 0;
      while( true ) {
        uVar4 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                       super_MultiAgentDecisionProcessDiscrete.
                                       super_MultiAgentDecisionProcess + 0x70))(this);
        if (uVar4 <= uVar3) break;
        pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
        (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel.
          _vptr_TransitionModel[5])(0x3fe0000000000000,pTVar1,uVar5,uVar3,uVar6);
        uVar3 = (ulong)((int)uVar3 + 1);
      }
      uVar3 = *(ulong *)&(this->super_DecPOMDPDiscrete).field_0x220;
    }
  }
  IVar2 = GetJointActionIndex(this,0,0);
  pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
  (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[5])
            (0x3ff0000000000000,pTVar1,0,(ulong)IVar2,0);
  pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
  (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[5])
            (0,pTVar1,0,(ulong)IVar2,1);
  pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
  (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[5])
            (0x3ff0000000000000,pTVar1,1,(ulong)IVar2,1);
  pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
  (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[5])
            (0,pTVar1,1,(ulong)IVar2,0);
  return;
}

Assistant:

void ProblemDecTigerWithCreaks::FillTransitionModel()
{
    // add transitions:
    for(Index s1=0; s1<NUMBER_OF_STATES;s1++) 
        for(Index s2=0; s2<NUMBER_OF_STATES;s2++) 
            for(Index ja=0; ja<GetNrJointActions(); ja++)
                SetTransitionProbability(s1, ja, s2, 0.5);

    Index jaListenListen=GetJointActionIndex(LISTEN,LISTEN);
    SetTransitionProbability(SLEFT, jaListenListen, SLEFT, 1.0);
    SetTransitionProbability(SLEFT, jaListenListen, SRIGHT, 0.0);
    SetTransitionProbability(SRIGHT, jaListenListen, SRIGHT, 1.0);
    SetTransitionProbability(SRIGHT, jaListenListen, SLEFT, 0.0);
}